

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O2

bool __thiscall SubCircuit<4>::propagateCheck(SubCircuit<4> *this)

{
  int *piVar1;
  IntView<4> *pIVar2;
  bool *pbVar3;
  IntVar *pIVar4;
  vec<int> *pvVar5;
  vec<int> *pvVar6;
  bool bVar7;
  int i_1;
  int iVar8;
  int iVar9;
  Lit *pLVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int i;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint size;
  long lVar17;
  int v;
  Clause *local_c0;
  vec<int> local_b8;
  vec<int> local_a8;
  vec<int> local_90;
  vec<int> local_80;
  vec<int> local_70;
  vec<int> local_60;
  vec<int> local_50;
  vec<int> local_40;
  
  uVar15 = (this->new_fixed).sz;
  piVar1 = (this->new_fixed).data;
  uVar16 = *(uint *)&(this->super_Propagator).field_0x14;
  uVar13 = 0;
  uVar12 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar12 = uVar13;
  }
  pIVar2 = this->x;
  do {
    if (uVar15 <= uVar13) {
      return true;
    }
    uVar16 = piVar1[uVar13];
    pbVar3 = this->inCircuit;
    for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
      pbVar3[uVar14] = false;
    }
    pbVar3 = this->inCircuit;
    uVar14 = (ulong)uVar16;
    lVar17 = 0;
    while( true ) {
      lVar11 = lVar17;
      iVar8 = (int)uVar14;
      pIVar4 = pIVar2[iVar8].var;
      iVar9 = (pIVar4->min).v;
      if (iVar9 != (pIVar4->max).v) break;
      pbVar3[iVar8] = true;
      uVar14 = (long)pIVar2[iVar8].b + (long)iVar9;
      lVar17 = lVar11 + 1;
      if (uVar14 == (long)(int)uVar16) {
        uVar15 = *(uint *)&(this->super_Propagator).field_0x14;
        size = (uint)lVar17;
        if ((int)uVar15 <= (int)size) {
          return true;
        }
        local_a8.sz = 0;
        local_a8.cap = 0;
        local_a8.data = (int *)0x0;
        iVar9 = 0;
        if (so.lazy == true) {
          if (so.checkexpl == 1) {
            local_c0 = Reason_new((int)lVar11 + 2);
            uVar15 = 0;
            while (size != uVar15) {
              iVar8 = (*((this->x[(int)uVar16].var)->super_Var).super_Branching._vptr_Branching[10])
                                ();
              uVar15 = uVar15 + 1;
              pLVar10 = Clause::operator[](local_c0,uVar15);
              pLVar10->x = iVar8;
              uVar16 = this->x[(int)uVar16].b + ((this->x[(int)uVar16].var)->min).v;
            }
            goto LAB_0013825f;
          }
          vec<int>::growTo(&local_a8,uVar15);
          for (lVar11 = 0; lVar11 < *(int *)&(this->super_Propagator).field_0x14;
              lVar11 = lVar11 + 1) {
            local_a8.data[lVar11] = (int)lVar11;
          }
          local_b8.sz = 0;
          local_b8.cap = 0;
          local_b8.data = (int *)0x0;
          vec<int>::growTo(&local_b8,size);
          lVar11 = 0;
          while (bVar7 = lVar17 != 0, lVar17 = lVar17 + -1, v = uVar16, bVar7) {
            *(uint *)((long)local_b8.data + lVar11) = uVar16;
            vec<int>::remove(&local_a8,(char *)&v);
            uVar16 = this->x[v].b + ((this->x[v].var)->min).v;
            lVar11 = lVar11 + 4;
          }
          local_c0 = Reason_new(local_a8.sz * local_b8.sz + 2);
          vec<int>::vec<int>(&local_80,&local_b8);
          iVar8 = chooseEvidenceVar(this,&local_80,so.checkevidence);
          free(local_80.data);
          local_80.data = (int *)0x0;
          lVar17 = (long)iVar8;
          pIVar4 = this->x[lVar17].var;
          iVar8 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xd])
                            (pIVar4,lVar17 - this->x[lVar17].b,1);
          pLVar10 = Clause::operator[](local_c0,1);
          pLVar10->x = iVar8;
          switch(so.checkexpl) {
          case 2:
            break;
          case 3:
switchD_00138157_caseD_3:
            vec<int>::vec<int>(&local_40,&local_a8);
            vec<int>::vec<int>(&local_50,&local_b8);
            explainAcantreachB(this,local_c0,2,&local_40,&local_50,-1,-1);
            pvVar5 = &local_50;
            pvVar6 = &local_40;
            goto LAB_00138237;
          case 4:
            if (local_a8.sz < local_b8.sz) goto switchD_00138157_caseD_3;
            break;
          case 5:
            if (local_b8.sz < local_a8.sz) goto switchD_00138157_caseD_3;
            break;
          default:
            fwrite("Unknown check explanation type\n",0x1f,1,_stderr);
          }
          vec<int>::vec<int>(&local_60,&local_b8);
          vec<int>::vec<int>(&local_70,&local_a8);
          explainAcantreachB(this,local_c0,2,&local_60,&local_70,-1,-1);
          pvVar6 = &local_60;
          pvVar5 = &local_70;
LAB_00138237:
          free(pvVar5->data);
          pvVar5->data = (int *)0x0;
          free(pvVar6->data);
          pvVar6->data = (int *)0x0;
          free(local_b8.data);
        }
        else {
          local_c0 = (Clause *)0x0;
        }
LAB_0013825f:
        local_b8.sz = 0;
        local_b8.cap = 0;
        local_b8.data = (int *)0x0;
        while (v = iVar9, iVar9 < *(int *)&(this->super_Propagator).field_0x14) {
          lVar17 = (long)iVar9;
          if (this->inCircuit[lVar17] == false) {
            pIVar2 = this->x;
            iVar9 = ((pIVar2[lVar17].var)->min).v;
            if ((iVar9 != ((pIVar2[lVar17].var)->max).v) ||
               ((long)pIVar2[lVar17].b + (long)iVar9 != lVar17)) {
              bVar7 = IntView<4>::indomain(pIVar2 + lVar17,lVar17);
              if (bVar7) {
                lVar17 = (long)v;
                pIVar4 = this->x[lVar17].var;
                iVar9 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0x10])
                                  (pIVar4,lVar17 - this->x[lVar17].b,local_c0,1);
                if ((char)iVar9 == '\0') {
                  fwrite("unexpected fail\n",0x10,1,_stderr);
                }
              }
              else {
                vec<int>::push(&local_b8,&v);
              }
            }
          }
          iVar9 = v + 1;
        }
        if (local_b8.sz != 0) {
          vec<int>::vec<int>(&local_90,&local_b8);
          iVar9 = chooseEvidenceVar(this,&local_90,so.checkevidence);
          free(local_90.data);
          local_90.data = (int *)0x0;
          lVar17 = (long)iVar9;
          pIVar4 = this->x[lVar17].var;
          iVar9 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0x10])
                            (pIVar4,lVar17 - this->x[lVar17].b,local_c0,1);
          if ((char)iVar9 != '\0') {
            fwrite("unexpected success\n",0x13,1,_stderr);
          }
          free(local_b8.data);
          free(local_a8.data);
          return false;
        }
        free(local_b8.data);
        free(local_a8.data);
        return true;
      }
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

bool propagateCheck() {
		// for each newly fixed variable, follow the chain and if you find a circuit
		// then any variable not in the circuit must have its own index as a value
		for (unsigned int i = 0; i < new_fixed.size(); i++) {
			// new_fixed should only contain variables fixed to values other than their own indices
			const int startVar = new_fixed[i];
			assert(x[startVar].isFixed());
			assert(x[startVar].getVal() != startVar);
			int nextVar = startVar;
			int chainLength = 0;

			// Clear the inCircuit array
			for (int i = 0; i < size; i++) {
				inCircuit[i] = false;
			}

			bool foundCycle = false;
			while (x[nextVar].isFixed()) {
				chainLength++;
				inCircuit[nextVar] = true;
				assert(chainLength <= size);
				if (x[nextVar].getVal() == startVar) {
					foundCycle = true;
					break;
				}
				nextVar = static_cast<int>(x[nextVar].getVal());
			}
			if (foundCycle && chainLength < size) {
				// fprintf(stderr,"found cycle length %d\n", chainLength);
				//  all variables not in the cycle must have their own indices as values
				Clause* r = nullptr;
				vec<int> notInCycle;
				bool doOutsideIn = false;
				if (so.lazy) {
					/*  r = Reason_new(chainLength + 1);
						int v = startVar;
						for(int j = 1 ; j <= chainLength; j++)
						{
								(*r)[j] = x[v].getValLit();
								v = x[v].getVal();
						}*/
					if (so.checkexpl == 1) {
						// equalities
						r = Reason_new(chainLength + 1);
						int v = startVar;
						for (int j = 1; j <= chainLength; j++) {
							(*r)[j] = x[v].getValLit();
							v = static_cast<int>(x[v].getVal());
						}
					} else {
						// find the vars in and not in the cycle
						notInCycle.growTo(size);
						for (int i = 0; i < size; i++) {
							notInCycle[i] = i;
						}
						vec<int> inCycle;
						inCycle.growTo(chainLength);
						int v = startVar;
						for (int j = 0; j < chainLength; j++) {
							inCycle[j] = v;
							notInCycle.remove(v);
							v = static_cast<int>(x[v].getVal());
						}
						r = Reason_new(inCycle.size() * notInCycle.size() + 2);
						// the first literal is an evidence literal from inside the circuit
						// choose the one from the highest level?
						const int chosenVar = chooseEvidenceVar(inCycle, so.checkevidence);
						(*r)[1] = x[chosenVar].getLit(chosenVar, LR_EQ);  // xi == i (is false)

						if (so.checkexpl == 2) {  // inside can't reach out
							doOutsideIn = false;
						} else if (so.checkexpl == 3) {  // outside can't reach in
							doOutsideIn = true;
						} else if (so.checkexpl == 4) {  // smaller group can't reach bigger group
							doOutsideIn = notInCycle.size() < inCycle.size();
						} else if (so.checkexpl == 5) {  // bigger group can't reach smaller group
							doOutsideIn = inCycle.size() < notInCycle.size();
						} else {
							fprintf(stderr, "Unknown check explanation type\n");
						}

						if (doOutsideIn) {
							explainAcantreachB(r, 2, notInCycle, inCycle);
						} else {
							explainAcantreachB(r, 2, inCycle, notInCycle);
						}
					}
				}

				// set all vars not in circuit to have own index as value
				// if one or more cannot do so, we need to choose which one(s)
				// to add clauses for.
				// options are: 1-first, 2-last, 3-high level, 4-low level
				vec<int> failIndices;
				for (int i = 0; i < size; i++) {
					if (!inCircuit[i]) {
						if (x[i].setValNotR(i)) {
							if (!x[i].remValNotR(i)) {
								failIndices.push(i);
								// fprintf(stderr,"prune\n");
							} else if (!x[i].setVal(i, r)) {
								fprintf(stderr, "unexpected fail\n");
							}
						}
					}
				}
				// now do the failing one(s) if there are any
				if (failIndices.size() > 0) {
					const int chosenIndex = chooseEvidenceVar(failIndices, so.checkevidence);
					if (x[chosenIndex].setVal(chosenIndex, r)) {
						fprintf(stderr, "unexpected success\n");
					}
					return false;
				}
			}

			// If we found a cycle stop here as all other fixed vars will be in the
			// same cycle (or we would have returned false already).
			if (foundCycle) {
				break;
			}
		}

		return true;
	}